

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O0

int __thiscall
soplex::SPxBoundFlippingRT<double>::selectLeave
          (SPxBoundFlippingRT<double> *this,double *val,double enterTest,bool polish)

{
  _func_int **pp_Var1;
  int iVar2;
  undefined8 uVar3;
  byte bVar4;
  bool bVar5;
  Representation RVar6;
  int iVar7;
  SPxRatioTester<double> *this_00;
  UpdateVector<double> *pUVar8;
  double *pdVar9;
  SSVectorBase<double> *this_01;
  SPxRatioTester<double> *pSVar10;
  SPxLPBase<double> *pSVar11;
  Breakpoint *pBVar12;
  Breakpoint *pBVar13;
  double *pdVar14;
  SPxBasisBase<double> *pSVar15;
  element_type *this_02;
  byte in_DL;
  SPxBoundFlippingRT<double> *in_RSI;
  SPxBoundFlippingRT<double> *in_RDI;
  double *in_XMM0_Qa;
  BreakpointCompare *compare_00;
  Real RVar16;
  SPxFastRT<double> *this_03;
  int breakpointidx_3;
  int breakpointidx_2;
  bool foundStable;
  double lowstab;
  double x;
  int breakpointidx_1;
  double stableDelta;
  double bestDelta;
  int bestBp;
  int stableBp;
  int i;
  SPxId baseId;
  double absupd;
  double lower;
  double upper;
  int breakpointidx;
  int sortsize;
  int sorted;
  BreakpointCompare compare;
  bool instable;
  double stab;
  double degeneps;
  int npassedBp;
  int nBp;
  double slope;
  int leaveIdx;
  double moststable;
  Breakpoint tmp;
  int minIdx;
  double max;
  double *ub;
  double *lb;
  int updnnz;
  int *idx;
  double *upd;
  double *vec;
  SPxLPBase<double> *pSVar17;
  SPxRatioTester<double> *pSVar18;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffffe74;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined1 uVar20;
  SPxFastRT<double> *upd_00;
  pointer in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 uVar21;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  bool local_139;
  double *in_stack_fffffffffffffed0;
  SPxFastRT<double> *upp;
  BreakpointSource BVar22;
  Real in_stack_fffffffffffffee0;
  SPxFastRT<double> *in_stack_fffffffffffffef0;
  double *in_stack_fffffffffffffef8;
  double dVar23;
  int in_stack_ffffffffffffff04;
  int iVar24;
  undefined4 in_stack_ffffffffffffff08;
  int iVar25;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  DataKey in_stack_ffffffffffffff18;
  SPxBoundFlippingRT<double> *in_stack_ffffffffffffff20;
  undefined1 uVar26;
  double in_stack_ffffffffffffff28;
  double *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar27;
  BreakpointSource in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  int iVar28;
  undefined4 in_stack_ffffffffffffff78;
  int iVar29;
  SPxBoundFlippingRT<double> *local_80;
  undefined4 uStack_6c;
  undefined8 uVar30;
  SPxRatioTester<double> *pSVar31;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar4 = in_DL & 1;
  if (((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->enterCount % 100
      == 0) {
    SPxOut::debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[38],_0>
              (in_RDI,(char (*) [38])"DEBFRT06 resetting long step history\n");
    in_RDI->flipPotential = 1.0;
  }
  if (((((bVar4 & 1) != 0) || (((in_RDI->super_SPxFastRT<double>).field_0x51 & 1) == 0)) ||
      (((in_RDI->super_SPxFastRT<double>).field_0x52 & 1) == 0)) ||
     ((RVar6 = SPxSolverBase<double>::rep
                         ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver),
      RVar6 == COLUMN || (in_RDI->flipPotential <= 0.0)))) {
    uVar21 = (undefined1)((ulong)in_stack_ffffffffffffff20 >> 0x38);
    SPxOut::debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[39],_0>
              (in_RDI,(char (*) [39])"DEBFRT07 switching to fast ratio test\n");
    iVar7 = SPxFastRT<double>::selectLeave
                      ((SPxFastRT<double> *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(bool)uVar21);
    return iVar7;
  }
  SPxSolverBase<double>::fVec
            ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  this_00 = (SPxRatioTester<double> *)
            VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2f6fee);
  pUVar8 = SPxSolverBase<double>::fVec
                     ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  UpdateVector<double>::delta(pUVar8);
  pdVar9 = SSVectorBase<double>::values((SSVectorBase<double> *)0x2f7017);
  pUVar8 = SPxSolverBase<double>::fVec
                     ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  this_01 = UpdateVector<double>::delta(pUVar8);
  SSVectorBase<double>::indexMem(this_01);
  pUVar8 = SPxSolverBase<double>::fVec
                     ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  UpdateVector<double>::delta(pUVar8);
  SSVectorBase<double>::size((SSVectorBase<double> *)0x2f7069);
  SPxSolverBase<double>::lbBound
            ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  pSVar10 = (SPxRatioTester<double> *)
            VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2f7088);
  SPxSolverBase<double>::ubBound
            ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  pSVar11 = (SPxLPBase<double> *)VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2f70a9);
  iVar29 = -1;
  pp_Var1 = (in_RSI->super_SPxFastRT<double>).super_SPxRatioTester<double>._vptr_SPxRatioTester;
  (in_RSI->super_SPxFastRT<double>).super_SPxRatioTester<double>._vptr_SPxRatioTester =
       (_func_int **)0x0;
  local_80 = (SPxBoundFlippingRT<double> *)0x0;
  iVar7 = 0;
  pSVar17 = pSVar11;
  pSVar18 = pSVar10;
  pSVar31 = this_00;
  if ((double)pp_Var1 <= 0.0) {
    uVar19 = 0xffffffff;
    collectBreakpointsMin
              (in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18,
               (int *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,in_stack_ffffffffffffff30,
               (double *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (double *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff48);
  }
  else {
    uVar19 = 0xffffffff;
    collectBreakpointsMax
              (in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18,
               (int *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,in_stack_ffffffffffffff30,
               (double *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (double *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff48);
  }
  if (iVar7 == 0) {
    (in_RSI->super_SPxFastRT<double>).super_SPxRatioTester<double>._vptr_SPxRatioTester = pp_Var1;
    return iVar29;
  }
  pBVar12 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                      ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)pSVar17,
                       (int)((ulong)this_00 >> 0x20));
  dVar23 = pBVar12->val;
  uVar30._0_4_ = pBVar12->idx;
  uStack_6c = pBVar12->src;
  pBVar12 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                      ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)pSVar17,
                       (int)((ulong)this_00 >> 0x20));
  pBVar13 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                      ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)pSVar17,
                       (int)((ulong)this_00 >> 0x20));
  pBVar13->val = pBVar12->val;
  BVar22 = pBVar12->src;
  pBVar13->idx = pBVar12->idx;
  pBVar13->src = BVar22;
  pBVar13 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                      ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)pSVar17,
                       (int)((ulong)this_00 >> 0x20));
  uVar3 = uVar30;
  pBVar13->val = dVar23;
  uStack_6c = (undefined4)((ulong)uVar30 >> 0x20);
  pBVar13->idx = (int)uVar30;
  pBVar13->src = uStack_6c;
  uVar30 = uVar3;
  compare_00 = (BreakpointCompare *)spxAbs<double>((Real)in_XMM0_Qa);
  if (((double)compare_00 == 0.0) && (!NAN((double)compare_00))) {
    compare_00 = (BreakpointCompare *)
                 ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                 instableEnterVal;
  }
  BreakpointCompare::BreakpointCompare((BreakpointCompare *)&stack0xffffffffffffff48);
  Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::get_const_ptr
            ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)0x2f72f8);
  iVar27 = 0;
  iVar28 = 0;
  while( true ) {
    uVar26 = (undefined1)((ulong)in_stack_ffffffffffffff20 >> 0x38);
    uVar21 = iVar28 < iVar7 && 0.0 < (double)compare_00;
    if (iVar28 >= iVar7 || 0.0 >= (double)compare_00) break;
    if (iVar27 < iVar28) {
      Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::get_ptr
                ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)0x2f7379);
      this_00 = (SPxRatioTester<double> *)((ulong)this_00 & 0xffffffff00000000);
      pSVar17 = (SPxLPBase<double> *)CONCAT44((int)((ulong)pSVar17 >> 0x20),1);
      iVar27 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                         ((Breakpoint *)CONCAT44(iVar29,in_stack_ffffffffffffff78),compare_00,iVar7,
                          iVar28,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                          (int)in_stack_ffffffffffffff60,(int)uVar30,
                          SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0));
    }
    pBVar13 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                        ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)pSVar17,
                         (int)((ulong)this_00 >> 0x20));
    in_stack_ffffffffffffff3c = pBVar13->idx;
    in_stack_ffffffffffffff20 =
         (SPxBoundFlippingRT<double> *)spxAbs<double>(pdVar9[in_stack_ffffffffffffff3c]);
    SPxBasisBase<double>::baseId((SPxBasisBase<double> *)pSVar17,(int)((ulong)this_00 >> 0x20));
    SPxLPBase<double>::number
              ((SPxLPBase<double> *)CONCAT44(in_stack_fffffffffffffe74,uVar19),(SPxId *)pSVar18);
    bVar5 = SPxId::isSPxColId((SPxId *)&stack0xffffffffffffff18);
    iVar25 = (int)((ulong)this_00 >> 0x20);
    if (bVar5) {
      in_stack_ffffffffffffff30 = SPxLPBase<double>::upper(pSVar17,iVar25);
      in_stack_ffffffffffffff30 = (double *)*in_stack_ffffffffffffff30;
      pdVar14 = SPxLPBase<double>::lower(pSVar17,(int)((ulong)this_00 >> 0x20));
      in_stack_ffffffffffffff28 = *pdVar14;
    }
    else {
      in_stack_ffffffffffffff30 = SPxLPBase<double>::rhs(pSVar17,iVar25);
      in_stack_ffffffffffffff30 = (double *)*in_stack_ffffffffffffff30;
      pdVar14 = SPxLPBase<double>::lhs(pSVar17,(int)((ulong)this_00 >> 0x20));
      in_stack_ffffffffffffff28 = *pdVar14;
    }
    compare_00 = (BreakpointCompare *)
                 ((double)compare_00 -
                 ((double)in_stack_ffffffffffffff30 * (double)in_stack_ffffffffffffff20 -
                 in_stack_ffffffffffffff28 * (double)in_stack_ffffffffffffff20));
    if ((double)local_80 < (double)in_stack_ffffffffffffff20) {
      local_80 = in_stack_ffffffffffffff20;
    }
    iVar28 = iVar28 + 1;
  }
  iVar28 = iVar28 + -1;
  pdVar14 = &(in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta;
  if ((*pdVar14 <= (double)compare_00 && (double)compare_00 != *pdVar14) && (iVar7 + -1 <= iVar28))
  {
    pSVar15 = SPxSolverBase<double>::basis
                        ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
    SPxBasisBase<double>::iteration(pSVar15);
    SPxOut::debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[42],_int,_0>
              (in_RDI,(char (*) [42])"DEBFRT02 {}: unboundedness in ratio test\n",
               (int *)&stack0xffffffffffffff10);
    in_RDI->flipPotential = in_RDI->flipPotential - 0.5;
    (in_RSI->super_SPxFastRT<double>).super_SPxRatioTester<double>._vptr_SPxRatioTester = pp_Var1;
    iVar7 = SPxFastRT<double>::selectLeave
                      ((SPxFastRT<double> *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(bool)uVar26);
    return iVar7;
  }
  pSVar15 = SPxSolverBase<double>::basis
                      ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  SPxBasisBase<double>::iteration(pSVar15);
  SPxOut::debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[44],_int,_int_&,_0>
            (in_RDI,(char (*) [44])"DEBFRT01 {}: number of flip candidates: {}\n",
             (int *)&stack0xffffffffffffff0c,(int *)&stack0xffffffffffffff68);
  iVar24 = -1;
  pBVar13 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                      ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)pSVar17,
                       (int)((ulong)this_00 >> 0x20));
  dVar23 = pBVar13->val;
  iVar25 = iVar28;
  do {
    while( true ) {
      iVar25 = iVar25 + 1;
      if (iVar7 <= iVar25) goto LAB_002f788c;
      in_stack_fffffffffffffef0 = (SPxFastRT<double> *)0x0;
      if (iVar27 < iVar25) {
        Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::get_ptr
                  ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)0x2f76ea);
        this_00 = (SPxRatioTester<double> *)((ulong)this_00 & 0xffffffff00000000);
        pSVar17 = (SPxLPBase<double> *)CONCAT44((int)((ulong)pSVar17 >> 0x20),1);
        iVar27 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                           ((Breakpoint *)CONCAT44(iVar29,in_stack_ffffffffffffff78),compare_00,
                            iVar7,iVar28,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (int)in_stack_ffffffffffffff60,(int)uVar30,
                            SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0));
      }
      pBVar13 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                          ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)pSVar17,
                           (int)((ulong)this_00 >> 0x20));
      iVar2 = pBVar13->idx;
      in_stack_fffffffffffffee0 = pdVar9[iVar2];
      RVar16 = spxAbs<double>(in_stack_fffffffffffffee0);
      if (RVar16 <= (double)local_80) break;
      if (in_stack_fffffffffffffee0 <= 0.0) {
        in_stack_fffffffffffffe90 = (pointer)(&pSVar10->_vptr_SPxRatioTester)[iVar2];
      }
      else {
        in_stack_fffffffffffffe90 =
             (&((_Vector_impl_data *)
               &(pSVar11->super_LPRowSetBase<double>).super_SVSetBase<double>.
                super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray)->_M_start)[iVar2];
      }
      in_stack_fffffffffffffef0 =
           (SPxFastRT<double> *)
           (((double)in_stack_fffffffffffffe90 - (double)(&pSVar31->_vptr_SPxRatioTester)[iVar2]) /
           in_stack_fffffffffffffee0);
      if ((double)in_stack_fffffffffffffef0 <= dVar23) {
        iVar24 = iVar25;
        local_80 = (SPxBoundFlippingRT<double> *)spxAbs<double>(in_stack_fffffffffffffee0);
        iVar25 = iVar24;
      }
    }
  } while ((double)in_stack_fffffffffffffef0 <=
           (in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta + dVar23);
LAB_002f788c:
  bVar5 = ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->instableEnter;
  SPxRatioTester<double>::tolerances(this_00);
  this_02 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2f78cf);
  this_03 = (SPxFastRT<double> *)Tolerances::scaleAccordingToEpsilon(this_02,1e-10);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2f78ef);
  upd_00 = this_03;
  upp = this_03;
  if ((bVar5 & 1U) == 0) {
    this_03 = (SPxFastRT<double> *)
              SPxFastRT<double>::minStability(&in_RDI->super_SPxFastRT<double>,(double)local_80);
  }
  uVar26 = (undefined1)((ulong)pSVar31 >> 0x38);
  iVar7 = (int)((ulong)this_00 >> 0x20);
  BVar22 = SUB84(in_stack_fffffffffffffee0,0);
  uVar30._0_4_ = (int)((ulong)pBVar12 >> 0x20);
  local_139 = false;
  if (iVar24 < 0) {
    while( true ) {
      uVar26 = (undefined1)((ulong)pSVar31 >> 0x38);
      iVar7 = (int)((ulong)this_00 >> 0x20);
      uVar20 = local_139 == false && -1 < iVar28;
      if (local_139 != false || -1 >= iVar28) break;
      pBVar13 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                          ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)pSVar17,iVar7);
      if (-1 < pBVar13->idx) {
        this_00 = pSVar10;
        pSVar17 = pSVar11;
        local_139 = getData((SPxBoundFlippingRT<double> *)
                            CONCAT44(pBVar13->idx,in_stack_fffffffffffffeb8),
                            (double *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                            (int *)in_RDI,(int)((ulong)pBVar12 >> 0x20),
                            (double)CONCAT17(uVar21,in_stack_fffffffffffffe98),
                            (double)in_stack_fffffffffffffe90,(double *)upd_00,(double *)this_03,
                            in_stack_fffffffffffffed0,(double *)upp,
                            SUB84(in_stack_fffffffffffffee0,0),
                            (double)CONCAT17(uVar20,in_stack_fffffffffffffe78));
      }
      iVar28 = iVar28 + -1;
    }
    iVar28 = iVar28 + 1;
  }
  else if ((double)this_03 < (double)local_80) {
    Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
              ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)pSVar17,iVar7);
    local_139 = getData((SPxBoundFlippingRT<double> *)
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                        (double *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (int *)in_RDI,(int)uVar30,(double)CONCAT17(uVar21,in_stack_fffffffffffffe98)
                        ,(double)in_stack_fffffffffffffe90,(double *)upd_00,(double *)this_03,
                        in_stack_fffffffffffffed0,(double *)upp,BVar22,
                        (double)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    iVar7 = (int)((ulong)pSVar10 >> 0x20);
    pSVar17 = pSVar11;
  }
  if (local_139 == false) {
    if (in_RDI->relax_count < 2) {
      pSVar15 = SPxSolverBase<double>::basis
                          ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)
      ;
      SPxBasisBase<double>::iteration(pSVar15);
      SPxOut::debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[52],_int,_0>
                (in_RDI,(char (*) [52])"DEBFRT04 {}: no valid leaveIdx found - relaxing...\n",
                 (int *)&stack0xfffffffffffffeb8);
      SPxFastRT<double>::relax(this_03);
      in_RDI->relax_count = in_RDI->relax_count + 1;
      (in_RSI->super_SPxFastRT<double>).super_SPxRatioTester<double>._vptr_SPxRatioTester = pp_Var1;
      iVar7 = selectLeave(in_RSI,in_XMM0_Qa,(double)CONCAT17(bVar4,in_stack_ffffffffffffffd8),
                          (bool)uVar26);
      return iVar7;
    }
    pSVar15 = SPxSolverBase<double>::basis
                        ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
    SPxBasisBase<double>::iteration(pSVar15);
    SPxOut::debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[52],_int,_0>
              (in_RDI,(char (*) [52])"DEBFRT05 {}: no valid leaveIdx found - breaking...\n",
               (int *)&stack0xfffffffffffffeb4);
    return iVar29;
  }
  in_RDI->relax_count = 0;
  SPxFastRT<double>::tighten(in_stack_fffffffffffffef0);
  if (0 < iVar28) {
    pBVar12 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                        ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)pSVar17,iVar7);
    RVar16 = spxAbs<double>(pBVar12->val);
    pdVar9 = &(in_RDI->super_SPxFastRT<double>).fastDelta;
    if (*pdVar9 <= RVar16 && RVar16 != *pdVar9) {
      flipAndUpdate((SPxBoundFlippingRT<double> *)lower,(int *)absupd);
      ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips =
           iVar28;
      if (iVar28 < 10) {
        in_RDI->flipPotential = in_RDI->flipPotential - 0.05;
      }
      else {
        in_RDI->flipPotential = 1.0;
      }
      goto LAB_002f7c95;
    }
  }
  ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips = 0;
  in_RDI->flipPotential = in_RDI->flipPotential - 0.1;
LAB_002f7c95:
  pSVar15 = SPxSolverBase<double>::basis
                      ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  SPxBasisBase<double>::iteration(pSVar15);
  SPxOut::debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[58],_int,_int_&,_int_&,_0>
            (in_RDI,(char (*) [58])"DEBFRT06 {}: selected Index: {} number of candidates: {}\n",
             (int *)&stack0xfffffffffffffeb0,(int *)&stack0xffffffffffffff7c,
             (int *)&stack0xffffffffffffff6c);
  return iVar29;
}

Assistant:

int SPxBoundFlippingRT<R>::selectLeave(
   R&                 val,
   R                  enterTest,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::ENTER);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->enterCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DEBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(polish || !enableBoundFlips || !enableRowBoundFlips
         || this->thesolver->rep() == SPxSolverBase<R>::COLUMN || flipPotential <= 0)
   {
      SPxOut::debug(this, "DEBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectLeave(val, enterTest, polish);
   }

   const R*  vec =
      this->thesolver->fVec().get_const_ptr();         /**< pointer to values of current VectorBase<R> */
   const R*  upd =
      this->thesolver->fVec().delta().values();        /**< pointer to update values of current VectorBase<R> */
   const int*   idx =
      this->thesolver->fVec().delta().indexMem();      /**< pointer to indices of current VectorBase<R> */
   int          updnnz =
      this->thesolver->fVec().delta().size();       /**< number of nonzeros in update VectorBase<R> */
   const R*  lb  =
      this->thesolver->lbBound().get_const_ptr();      /**< pointer to lower bound/lhs of current VectorBase<R> */
   const R*  ub  =
      this->thesolver->ubBound().get_const_ptr();      /**< pointer to upper bound/rhs of current VectorBase<R> */

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid leaving index
   int leaveIdx = -1;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   assert(this->thesolver->fVec().delta().isSetup());

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, idx, updnnz, upd, vec, ub, lb, FVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, idx, updnnz, upd, vec, ub, lb, FVEC);
   }

   // return -1 if no BP was found
   if(nBp == 0)
   {
      val = max;
      return leaveIdx;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(enterTest);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableEnterId.isValid());
      // restore original slope
      slope = this->thesolver->instableEnterVal;
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      assert(breakpoints[npassedBp].src == FVEC);
      int breakpointidx = breakpoints[npassedBp].idx;
      // compute new slope
      R upper;
      R lower;
      R absupd = spxAbs(upd[breakpointidx]);
      SPxId baseId = this->thesolver->baseId(breakpointidx);
      int i = this->thesolver->number(baseId);

      if(baseId.isSPxColId())
      {
         upper = this->thesolver->upper(i);
         lower = this->thesolver->lower(i);
      }
      else
      {
         assert(baseId.isSPxRowId());
         upper = this->thesolver->rhs(i);
         lower = this->thesolver->lhs(i);
      }

      slope -= (upper * absupd) - (lower * absupd);

      // get most stable pivot
      if(absupd > moststable)
         moststable = absupd;
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DEBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectLeave(val, enterTest);
   }

   SPxOut::debug(this, "DEBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int breakpointidx = breakpoints[stableBp].idx;
      assert(breakpoints[stableBp].src == FVEC);
      R x = upd[breakpointidx];

      if(spxAbs(x) > moststable)
      {
         stableDelta = (x > 0.0) ? ub[breakpointidx] : lb[breakpointidx];
         stableDelta = (stableDelta - vec[breakpointidx]) / x;

         if(stableDelta <= bestDelta)
         {
            moststable = spxAbs(x);
            bestBp = stableBp;
         }
      }
      // stop searching if the step length is too big
      else if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableEnter;
   assert(!instable || this->thesolver->instableEnterId.isValid());
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int breakpointidx = breakpoints[bestBp].idx;
         assert(breakpointidx >= 0);
         foundStable = getData(val, leaveIdx, breakpointidx, moststable, degeneps, upd, vec, lb, ub, FVEC,
                               max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int breakpointidx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(breakpointidx >= 0)
         {
            foundStable = getData(val, leaveIdx, breakpointidx, moststable, degeneps, upd, vec, lb, ub, FVEC,
                                  max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(leaveIdx < 0);

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DEBFRT04 {}: no valid leaveIdx found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectLeave(val, enterTest);
      }
      else
      {
         SPxOut::debug(this, "DEBFRT05 {}: no valid leaveIdx found - breaking...\n",
                       this->thesolver->basis().iteration());
         return leaveIdx;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DEBFRT06 {}: selected Index: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), leaveIdx, nBp);

   return leaveIdx;
}